

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8 *target)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  EpsCopyOutputStream out;
  LogFinisher local_21;
  
  iVar1 = (*this->_vptr_MessageLite[10])();
  out.stream_._2_1_ = io::CodedOutputStream::default_serialization_deterministic_ & 1;
  out.end_ = (uint8 *)0x0;
  out.buffer_[0x18] = '\0';
  out.buffer_[0x19] = '\0';
  out.buffer_[0x1a] = '\0';
  out.buffer_[0x1b] = '\0';
  out.buffer_[0x1c] = '\0';
  out.buffer_[0x1d] = '\0';
  out.buffer_[0x1e] = '\0';
  out.buffer_[0x1f] = '\0';
  out.stream_._0_2_ = 0;
  iVar2 = (*this->_vptr_MessageLite[0xc])(this,target);
  if (target + iVar1 != (uint8 *)CONCAT44(extraout_var,iVar2)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&out.had_error_,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
               ,0x168);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&out.had_error_,"CHECK failed: target + size == res: ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage((LogMessage *)&out.had_error_);
  }
  return (uint8 *)CONCAT44(extraout_var,iVar2);
}

Assistant:

uint8* MessageLite::SerializeWithCachedSizesToArray(uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}